

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O0

FT_UInt32 fnt_cmap_char_next(FNT_CMap cmap,FT_UInt32 *pchar_code)

{
  uint uVar1;
  FT_UInt32 local_20;
  FT_UInt32 char_code;
  FT_UInt32 result;
  FT_UInt gindex;
  FT_UInt32 *pchar_code_local;
  FNT_CMap cmap_local;
  
  char_code = 0;
  local_20 = 0;
  if (cmap->first < *pchar_code + 1) {
    uVar1 = (*pchar_code + 1) - cmap->first;
    if (uVar1 < cmap->count) {
      local_20 = cmap->first + uVar1;
      char_code = uVar1 + 1;
    }
  }
  else {
    local_20 = cmap->first;
    char_code = 1;
  }
  *pchar_code = local_20;
  return char_code;
}

Assistant:

static FT_UInt32
  fnt_cmap_char_next( FNT_CMap    cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_UInt    gindex = 0;
    FT_UInt32  result = 0;
    FT_UInt32  char_code = *pchar_code + 1;


    if ( char_code <= cmap->first )
    {
      result = cmap->first;
      gindex = 1;
    }
    else
    {
      char_code -= cmap->first;
      if ( char_code < cmap->count )
      {
        result = cmap->first + char_code;
        gindex = (FT_UInt)( char_code + 1 );
      }
    }

    *pchar_code = result;
    return gindex;
  }